

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuadrature.h
# Opt level: O3

void chrono::ChQuadrature::Integrate3D<Eigen::Matrix<double,33,1,0,33,1>>
               (Matrix<double,_33,_1,_0,_33,_1> *result,
               ChIntegrable3D<Eigen::Matrix<double,_33,_1,_0,_33,_1>_> *integrand,double Xa,
               double Xb,double Ya,double Yb,double Za,double Zb,int order)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  long lVar6;
  double dVar7;
  ChQuadratureTables *pCVar8;
  pointer pdVar9;
  undefined8 uVar10;
  pointer pdVar11;
  ulong uVar12;
  pointer pdVar13;
  ActualDstType actualDst;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  pointer pvVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [64];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar76 [16];
  undefined1 auVar78 [16];
  undefined1 in_ZMM16 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  Matrix<double,_33,_1,_0,_33,_1> val;
  ChQuadratureTables *local_190;
  pointer local_188;
  double local_138;
  double dStack_130;
  double local_128;
  double dStack_120;
  double local_118;
  double dStack_110;
  double local_108;
  double dStack_100;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double dStack_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  ulong local_38;
  undefined1 auVar41 [64];
  undefined1 auVar45 [64];
  undefined1 auVar48 [64];
  undefined1 auVar51 [64];
  undefined1 auVar54 [64];
  undefined1 auVar57 [64];
  undefined1 auVar60 [64];
  undefined1 auVar63 [64];
  undefined1 auVar66 [64];
  undefined1 auVar69 [64];
  undefined1 auVar72 [64];
  undefined1 auVar75 [64];
  undefined1 auVar77 [64];
  undefined1 auVar79 [64];
  
  auVar22 = in_ZMM16._0_16_;
  pCVar8 = GetStaticTables();
  uVar16 = ((long)(pCVar8->Lroots).
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pCVar8->Lroots).
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  if (uVar16 < (uint)order) {
    local_190 = (ChQuadratureTables *)::operator_new(0x30);
    ChQuadratureTables::ChQuadratureTables(local_190,order,order);
    ChQuadratureTables::PrintTables(local_190);
    local_188 = (local_190->Weight).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    pvVar20 = (local_190->Lroots).
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  else {
    local_190 = GetStaticTables();
    pvVar20 = (local_190->Lroots).
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + (long)order + -1;
    local_188 = (local_190->Weight).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + (long)order + -1;
  }
  auVar21 = vxorpd_avx512vl(auVar22,auVar22);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = Xb;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = Xa;
  auVar22 = vsubsd_avx512f(auVar83,auVar88);
  auVar23 = vmulsd_avx512f(auVar22,ZEXT816(0x3fe0000000000000));
  auVar86._8_8_ = 0;
  auVar86._0_8_ = Yb;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = Ya;
  auVar22 = vsubsd_avx512f(auVar86,auVar87);
  auVar24 = vmulsd_avx512f(auVar22,ZEXT816(0x3fe0000000000000));
  auVar84._8_8_ = 0;
  auVar84._0_8_ = Zb;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = Za;
  auVar22 = vsubsd_avx512f(auVar84,auVar85);
  auVar81 = ZEXT816(0x3fe0000000000000);
  auVar25 = vmulsd_avx512f(auVar22,auVar81);
  auVar26._0_8_ =
       (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
       array[0] * 0.0;
  auVar26._8_8_ =
       (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
       array[1] * 0.0;
  auVar31 = ZEXT1664(auVar26);
  *(undefined1 (*) [16])
   (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array =
       auVar26;
  auVar27._0_8_ =
       (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
       array[2] * 0.0;
  auVar27._8_8_ =
       (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
       array[3] * 0.0;
  auVar36 = ZEXT1664(auVar27);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
   + 2) = auVar27;
  auVar37._0_8_ =
       (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
       array[4] * 0.0;
  auVar37._8_8_ =
       (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
       array[5] * 0.0;
  auVar41 = ZEXT1664(auVar37);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
   + 4) = auVar37;
  auVar42._0_8_ =
       (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
       array[6] * 0.0;
  auVar42._8_8_ =
       (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
       array[7] * 0.0;
  auVar45 = ZEXT1664(auVar42);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
   + 6) = auVar42;
  auVar46._0_8_ =
       (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
       array[8] * 0.0;
  auVar46._8_8_ =
       (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
       array[9] * 0.0;
  auVar48 = ZEXT1664(auVar46);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
   + 8) = auVar46;
  auVar49._0_8_ =
       (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
       array[10] * 0.0;
  auVar49._8_8_ =
       (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
       array[0xb] * 0.0;
  auVar51 = ZEXT1664(auVar49);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
   + 10) = auVar49;
  auVar52._0_8_ =
       (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
       array[0xc] * 0.0;
  auVar52._8_8_ =
       (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
       array[0xd] * 0.0;
  auVar54 = ZEXT1664(auVar52);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
   + 0xc) = auVar52;
  auVar55._0_8_ =
       (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
       array[0xe] * 0.0;
  auVar55._8_8_ =
       (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
       array[0xf] * 0.0;
  auVar57 = ZEXT1664(auVar55);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
   + 0xe) = auVar55;
  auVar58._0_8_ =
       (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
       array[0x10] * 0.0;
  auVar58._8_8_ =
       (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
       array[0x11] * 0.0;
  auVar60 = ZEXT1664(auVar58);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
   + 0x10) = auVar58;
  auVar61._0_8_ =
       (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
       array[0x12] * 0.0;
  auVar61._8_8_ =
       (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
       array[0x13] * 0.0;
  auVar63 = ZEXT1664(auVar61);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
   + 0x12) = auVar61;
  auVar64._0_8_ =
       (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
       array[0x14] * 0.0;
  auVar64._8_8_ =
       (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
       array[0x15] * 0.0;
  auVar66 = ZEXT1664(auVar64);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
   + 0x14) = auVar64;
  auVar67._0_8_ =
       (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
       array[0x16] * 0.0;
  auVar67._8_8_ =
       (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
       array[0x17] * 0.0;
  auVar69 = ZEXT1664(auVar67);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
   + 0x16) = auVar67;
  auVar70._0_8_ =
       (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
       array[0x18] * 0.0;
  auVar70._8_8_ =
       (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
       array[0x19] * 0.0;
  auVar72 = ZEXT1664(auVar70);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
   + 0x18) = auVar70;
  auVar73._0_8_ =
       (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
       array[0x1a] * 0.0;
  auVar73._8_8_ =
       (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
       array[0x1b] * 0.0;
  auVar75 = ZEXT1664(auVar73);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
   + 0x1a) = auVar73;
  auVar76._0_8_ =
       (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
       array[0x1c] * 0.0;
  auVar76._8_8_ =
       (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
       array[0x1d] * 0.0;
  auVar77 = ZEXT1664(auVar76);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
   + 0x1c) = auVar76;
  auVar78._0_8_ =
       (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
       array[0x1e] * 0.0;
  auVar78._8_8_ =
       (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
       array[0x1f] * 0.0;
  auVar79 = ZEXT1664(auVar78);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
   + 0x1e) = auVar78;
  auVar22._8_8_ = 0;
  auVar22._0_8_ =
       (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
       array[0x20];
  auVar22 = vmulsd_avx512f(auVar21,auVar22);
  auVar80 = ZEXT1664(auVar22);
  pdVar1 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data
           .array + 0x20;
  vmovsd_avx512f(auVar22);
  *pdVar1 = *pdVar1;
  pdVar9 = (pvVar20->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar11 = (pvVar20->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (pdVar11 != pdVar9) {
    auVar22 = vaddsd_avx512f(auVar88,auVar83);
    auVar21 = vaddsd_avx512f(auVar85,auVar84);
    uVar17 = 0;
    auVar22 = vmulsd_avx512f(auVar22,auVar81);
    vmovsd_avx512f(auVar22);
    auVar22 = vaddsd_avx512f(auVar87,auVar86);
    auVar22 = vmulsd_avx512f(auVar22,auVar81);
    auVar21 = vmulsd_avx512f(auVar21,auVar81);
    vmovsd_avx512f(auVar22);
    vmovsd_avx512f(auVar21);
    do {
      pdVar13 = pdVar9;
      if (pdVar11 != pdVar9) {
        uVar14 = 0;
        pdVar13 = pdVar11;
        do {
          uVar18 = 1;
          uVar19 = 0;
          uVar12 = (long)pdVar13 - (long)pdVar9 >> 3;
          do {
            uVar15 = uVar17;
            if ((uVar12 <= uVar17) || (uVar15 = uVar14, uVar12 <= uVar14)) {
LAB_006de945:
              uVar10 = std::__throw_out_of_range_fmt
                                 ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                  ,uVar15);
              operator_delete(pvVar20,0x30);
              _Unwind_Resume(uVar10);
            }
            auVar28._8_8_ = 0;
            auVar28._0_8_ = pdVar9[uVar17];
            auVar32._8_8_ = 0;
            auVar32._0_8_ = Xb;
            auVar38._8_8_ = 0;
            auVar38._0_8_ = Yb;
            auVar43._8_8_ = 0;
            auVar43._0_8_ = Zb;
            auVar21._8_8_ = 0;
            auVar21._0_8_ = auVar23._0_8_;
            auVar22 = vfmadd132sd_fma(auVar28,auVar32,auVar21);
            auVar33._8_8_ = 0;
            auVar33._0_8_ = pdVar9[uVar14];
            auVar81._8_8_ = 0;
            auVar81._0_8_ = auVar24._0_8_;
            auVar21 = vfmadd132sd_fma(auVar33,auVar38,auVar81);
            auVar39._8_8_ = 0;
            auVar39._0_8_ = pdVar9[uVar19];
            auVar2._8_8_ = 0;
            auVar2._0_8_ = auVar25._0_8_;
            auVar26 = vfmadd132sd_fma(auVar39,auVar43,auVar2);
            (*integrand->_vptr_ChIntegrable3D[2])
                      (auVar22._0_8_,auVar21._0_8_,auVar26._0_8_,integrand,&local_138);
            lVar6 = *(long *)&(local_188->super__Vector_base<double,_std::allocator<double>_>).
                              _M_impl;
            uVar12 = (long)(local_188->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_finish - lVar6 >> 3;
            uVar15 = uVar17;
            if ((uVar12 <= uVar17) ||
               ((uVar15 = uVar14, uVar12 <= uVar14 || (uVar15 = uVar19, uVar12 <= uVar19))))
            goto LAB_006de945;
            dVar7 = *(double *)(lVar6 + uVar17 * 8) * *(double *)(lVar6 + uVar14 * 8) *
                    *(double *)(lVar6 + uVar19 * 8);
            uVar19 = (ulong)uVar18;
            uVar18 = uVar18 + 1;
            auVar34._8_8_ = dVar7;
            auVar34._0_8_ = dVar7;
            local_138 = dVar7 * local_138;
            dStack_130 = dVar7 * dStack_130;
            local_128 = dVar7 * local_128;
            dStack_120 = dVar7 * dStack_120;
            local_118 = dVar7 * local_118;
            dStack_110 = dVar7 * dStack_110;
            local_108 = dVar7 * local_108;
            dStack_100 = dVar7 * dStack_100;
            local_f8 = dVar7 * local_f8;
            dStack_f0 = dVar7 * dStack_f0;
            local_e8 = dVar7 * local_e8;
            dStack_e0 = dVar7 * dStack_e0;
            local_d8 = dVar7 * local_d8;
            dStack_d0 = dVar7 * dStack_d0;
            local_c8 = dVar7 * local_c8;
            dStack_c0 = dVar7 * dStack_c0;
            local_b8 = dVar7 * local_b8;
            dStack_b0 = dVar7 * dStack_b0;
            local_a8 = dVar7 * local_a8;
            dStack_a0 = dVar7 * dStack_a0;
            local_98 = dVar7 * local_98;
            dStack_90 = dVar7 * dStack_90;
            local_88 = dVar7 * local_88;
            dStack_80 = dVar7 * dStack_80;
            local_78 = dVar7 * local_78;
            dStack_70 = dVar7 * dStack_70;
            local_68 = dVar7 * local_68;
            dStack_60 = dVar7 * dStack_60;
            local_58 = vmulpd_avx512vl(auVar34,local_58);
            local_48 = vmulpd_avx512vl(auVar34,local_48);
            auVar3._8_8_ = 0;
            auVar3._0_8_ = local_38;
            auVar29._8_8_ = 0;
            auVar29._0_8_ = dVar7;
            auVar22 = vmulsd_avx512f(auVar29,auVar3);
            vmovsd_avx512f(auVar22);
            auVar30._0_8_ =
                 local_138 +
                 (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
                 m_data.array[0];
            auVar30._8_8_ =
                 dStack_130 +
                 (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
                 m_data.array[1];
            auVar31 = ZEXT1664(auVar30);
            *(undefined1 (*) [16])
             (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
             m_data.array = auVar30;
            auVar35._0_8_ =
                 local_128 +
                 (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
                 m_data.array[2];
            auVar35._8_8_ =
                 dStack_120 +
                 (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
                 m_data.array[3];
            auVar36 = ZEXT1664(auVar35);
            *(undefined1 (*) [16])
             ((result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
              m_data.array + 2) = auVar35;
            auVar40._0_8_ =
                 local_118 +
                 (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
                 m_data.array[4];
            auVar40._8_8_ =
                 dStack_110 +
                 (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
                 m_data.array[5];
            auVar41 = ZEXT1664(auVar40);
            *(undefined1 (*) [16])
             ((result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
              m_data.array + 4) = auVar40;
            auVar44._0_8_ =
                 local_108 +
                 (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
                 m_data.array[6];
            auVar44._8_8_ =
                 dStack_100 +
                 (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
                 m_data.array[7];
            auVar45 = ZEXT1664(auVar44);
            *(undefined1 (*) [16])
             ((result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
              m_data.array + 6) = auVar44;
            auVar47._0_8_ =
                 local_f8 +
                 (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
                 m_data.array[8];
            auVar47._8_8_ =
                 dStack_f0 +
                 (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
                 m_data.array[9];
            auVar48 = ZEXT1664(auVar47);
            *(undefined1 (*) [16])
             ((result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
              m_data.array + 8) = auVar47;
            auVar50._0_8_ =
                 local_e8 +
                 (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
                 m_data.array[10];
            auVar50._8_8_ =
                 dStack_e0 +
                 (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
                 m_data.array[0xb];
            auVar51 = ZEXT1664(auVar50);
            *(undefined1 (*) [16])
             ((result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
              m_data.array + 10) = auVar50;
            auVar53._0_8_ =
                 local_d8 +
                 (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
                 m_data.array[0xc];
            auVar53._8_8_ =
                 dStack_d0 +
                 (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
                 m_data.array[0xd];
            auVar54 = ZEXT1664(auVar53);
            *(undefined1 (*) [16])
             ((result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
              m_data.array + 0xc) = auVar53;
            auVar56._0_8_ =
                 local_c8 +
                 (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
                 m_data.array[0xe];
            auVar56._8_8_ =
                 dStack_c0 +
                 (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
                 m_data.array[0xf];
            auVar57 = ZEXT1664(auVar56);
            *(undefined1 (*) [16])
             ((result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
              m_data.array + 0xe) = auVar56;
            auVar59._0_8_ =
                 local_b8 +
                 (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
                 m_data.array[0x10];
            auVar59._8_8_ =
                 dStack_b0 +
                 (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
                 m_data.array[0x11];
            auVar60 = ZEXT1664(auVar59);
            *(undefined1 (*) [16])
             ((result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
              m_data.array + 0x10) = auVar59;
            auVar62._0_8_ =
                 local_a8 +
                 (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
                 m_data.array[0x12];
            auVar62._8_8_ =
                 dStack_a0 +
                 (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
                 m_data.array[0x13];
            auVar63 = ZEXT1664(auVar62);
            *(undefined1 (*) [16])
             ((result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
              m_data.array + 0x12) = auVar62;
            auVar65._0_8_ =
                 local_98 +
                 (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
                 m_data.array[0x14];
            auVar65._8_8_ =
                 dStack_90 +
                 (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
                 m_data.array[0x15];
            auVar66 = ZEXT1664(auVar65);
            *(undefined1 (*) [16])
             ((result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
              m_data.array + 0x14) = auVar65;
            auVar68._0_8_ =
                 local_88 +
                 (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
                 m_data.array[0x16];
            auVar68._8_8_ =
                 dStack_80 +
                 (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
                 m_data.array[0x17];
            auVar69 = ZEXT1664(auVar68);
            *(undefined1 (*) [16])
             ((result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
              m_data.array + 0x16) = auVar68;
            auVar71._0_8_ =
                 local_78 +
                 (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
                 m_data.array[0x18];
            auVar71._8_8_ =
                 dStack_70 +
                 (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
                 m_data.array[0x19];
            auVar72 = ZEXT1664(auVar71);
            *(undefined1 (*) [16])
             ((result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
              m_data.array + 0x18) = auVar71;
            auVar74._0_8_ =
                 local_68 +
                 (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
                 m_data.array[0x1a];
            auVar74._8_8_ =
                 dStack_60 +
                 (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
                 m_data.array[0x1b];
            auVar75 = ZEXT1664(auVar74);
            *(undefined1 (*) [16])
             ((result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
              m_data.array + 0x1a) = auVar74;
            auVar21 = vaddpd_avx512vl(local_58,*(undefined1 (*) [16])
                                                ((result->
                                                 super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>
                                                 ).m_storage.m_data.array + 0x1c));
            auVar77 = ZEXT1664(auVar21);
            *(undefined1 (*) [16])
             ((result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
              m_data.array + 0x1c) = auVar21;
            auVar21 = vaddpd_avx512vl(local_48,*(undefined1 (*) [16])
                                                ((result->
                                                 super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>
                                                 ).m_storage.m_data.array + 0x1e));
            auVar79 = ZEXT1664(auVar21);
            *(undefined1 (*) [16])
             ((result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
              m_data.array + 0x1e) = auVar21;
            auVar4._8_8_ = 0;
            auVar4._0_8_ = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).
                           m_storage.m_data.array[0x20];
            auVar22 = vaddsd_avx512f(auVar22,auVar4);
            auVar80 = ZEXT1664(auVar22);
            pdVar1 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).
                     m_storage.m_data.array + 0x20;
            vmovsd_avx512f(auVar22);
            *pdVar1 = *pdVar1;
            pdVar13 = (pvVar20->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_finish;
            pdVar9 = (pvVar20->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            uVar12 = (long)pdVar13 - (long)pdVar9 >> 3;
          } while (uVar19 < uVar12);
          uVar14 = (ulong)((int)uVar14 + 1);
        } while ((uVar14 < uVar12) && (pdVar13 != pdVar9));
      }
      auVar22 = auVar80._0_16_;
      auVar78 = auVar79._0_16_;
      auVar76 = auVar77._0_16_;
      auVar73 = auVar75._0_16_;
      auVar70 = auVar72._0_16_;
      auVar67 = auVar69._0_16_;
      auVar64 = auVar66._0_16_;
      auVar61 = auVar63._0_16_;
      auVar58 = auVar60._0_16_;
      auVar55 = auVar57._0_16_;
      auVar52 = auVar54._0_16_;
      auVar49 = auVar51._0_16_;
      auVar46 = auVar48._0_16_;
      auVar42 = auVar45._0_16_;
      auVar37 = auVar41._0_16_;
      auVar27 = auVar36._0_16_;
      auVar26 = auVar31._0_16_;
      uVar17 = (ulong)((int)uVar17 + 1);
      pdVar11 = pdVar13;
    } while (uVar17 < (ulong)((long)pdVar13 - (long)pdVar9 >> 3));
  }
  auVar5._8_8_ = 0;
  auVar5._0_8_ = auVar23._0_8_;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = auVar24._0_8_;
  auVar21 = vmulsd_avx512f(auVar82,auVar5);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = auVar25._0_8_;
  auVar21 = vmulsd_avx512f(auVar21,auVar23);
  auVar23 = vmovddup_avx512vl(auVar21);
  auVar24 = vmulpd_avx512vl(auVar23,auVar26);
  auVar25 = vmulpd_avx512vl(auVar23,auVar27);
  auVar26 = vmulpd_avx512vl(auVar23,auVar37);
  auVar27 = vmulpd_avx512vl(auVar23,auVar42);
  *(undefined1 (*) [16])
   (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array =
       auVar24;
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
   + 2) = auVar25;
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
   + 4) = auVar26;
  auVar24 = vmulpd_avx512vl(auVar23,auVar46);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
   + 6) = auVar27;
  auVar25 = vmulpd_avx512vl(auVar23,auVar49);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
   + 8) = auVar24;
  auVar24 = vmulpd_avx512vl(auVar23,auVar52);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
   + 10) = auVar25;
  auVar25 = vmulpd_avx512vl(auVar23,auVar55);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
   + 0xc) = auVar24;
  auVar24 = vmulpd_avx512vl(auVar23,auVar58);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
   + 0xe) = auVar25;
  auVar25 = vmulpd_avx512vl(auVar23,auVar61);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
   + 0x10) = auVar24;
  auVar24 = vmulpd_avx512vl(auVar23,auVar64);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
   + 0x12) = auVar25;
  auVar25 = vmulpd_avx512vl(auVar23,auVar67);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
   + 0x14) = auVar24;
  auVar24 = vmulpd_avx512vl(auVar23,auVar70);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
   + 0x16) = auVar25;
  auVar25 = vmulpd_avx512vl(auVar23,auVar73);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
   + 0x18) = auVar24;
  auVar24 = vmulpd_avx512vl(auVar23,auVar76);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
   + 0x1a) = auVar25;
  auVar23 = vmulpd_avx512vl(auVar23,auVar78);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
   + 0x1c) = auVar24;
  auVar22 = vmulsd_avx512f(auVar21,auVar22);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
   + 0x1e) = auVar23;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
  [0x20] = auVar22._0_8_;
  if (uVar16 < (uint)order) {
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_190->Lroots);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_190->Weight);
    operator_delete(local_190,0x30);
  }
  return;
}

Assistant:

static void Integrate3D(T& result,                     ///< result is returned here
                            ChIntegrable3D<T>& integrand,  ///< this is the integrand
                            const double Xa,               ///< min limit for x domain
                            const double Xb,               ///< min limit for x domain
                            const double Ya,               ///< min limit for y domain
                            const double Yb,               ///< min limit for y domain
                            const double Za,               ///< min limit for z domain
                            const double Zb,               ///< min limit for z domain
                            const int order)               ///< order of integration
    {
        ChQuadratureTables* mtables = 0;
        std::vector<double>* lroots;
        std::vector<double>* weight;
        bool static_tables;

        if ((unsigned int)order <= GetStaticTables()->Lroots.size()) {
            mtables = GetStaticTables();
            lroots = &mtables->Lroots[order - 1];
            weight = &mtables->Weight[order - 1];
            static_tables = true;
        } else {
            mtables = new ChQuadratureTables(order, order);
            mtables->PrintTables();
            lroots = &mtables->Lroots[0];
            weight = &mtables->Weight[0];
            static_tables = false;
        }

        double Xc1 = (Xb - Xa) / 2;
        double Xc2 = (Xb + Xa) / 2;
        double Yc1 = (Yb - Ya) / 2;
        double Yc2 = (Yb + Ya) / 2;
        double Zc1 = (Zb - Za) / 2;
        double Zc2 = (Zb + Za) / 2;

        result *= 0;  // as result = 0, but works also for matrices.
        T val;        // temporary value for loop

        for (unsigned int ix = 0; ix < lroots->size(); ix++)
            for (unsigned int iy = 0; iy < lroots->size(); iy++)
                for (unsigned int iz = 0; iz < lroots->size(); iz++) {
                    integrand.Evaluate(val, (Xc1 * lroots->at(ix) + Xc2), (Yc1 * lroots->at(iy) + Yc2),
                                       (Zc1 * lroots->at(iz) + Zc2));
                    val *= (weight->at(ix) * weight->at(iy) * weight->at(iz));
                    result += val;
                }
        result *= (Xc1 * Yc1 * Zc1);

        if (!static_tables)
            delete mtables;
    }